

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpServer.cpp
# Opt level: O2

void __thiscall gnl::FtpServer::removeFd(FtpServer *this,int closeFd)

{
  _Base_ptr this_00;
  ssize_t sVar1;
  iterator iVar2;
  ostream *poVar3;
  int revFd;
  char fd [16];
  
  fd[0] = '\0';
  fd[1] = '\0';
  fd[2] = '\0';
  fd[3] = '\0';
  fd[4] = '\0';
  fd[5] = '\0';
  fd[6] = '\0';
  fd[7] = '\0';
  fd[8] = '\0';
  fd[9] = '\0';
  fd[10] = '\0';
  fd[0xb] = '\0';
  fd[0xc] = '\0';
  fd[0xd] = '\0';
  fd[0xe] = '\0';
  fd[0xf] = '\0';
  sVar1 = read(closeFd,fd,0x11);
  if ((int)sVar1 == -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"read colseFd error!");
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  if ((int)sVar1 != 0) {
    revFd = atoi(fd);
    if (2 < revFd) {
      iVar2 = std::
              _Rb_tree<int,_std::pair<const_int,_gnl::FtpConsole_&>,_std::_Select1st<std::pair<const_int,_gnl::FtpConsole_&>_>,_std::less<int>,_std::allocator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
              ::find(&(this->mConnection)._M_t,&revFd);
      this_00 = iVar2._M_node[1]._M_parent;
      if (this_00 != (_Base_ptr)0x0) {
        FtpConsole::~FtpConsole((FtpConsole *)this_00);
      }
      operator_delete(this_00);
      std::
      _Rb_tree<int,_std::pair<const_int,_gnl::FtpConsole_&>,_std::_Select1st<std::pair<const_int,_gnl::FtpConsole_&>_>,_std::less<int>,_std::allocator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
      ::erase(&(this->mConnection)._M_t,&revFd);
      close(revFd);
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"closeFd[1] has been closed !");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

void FtpServer::removeFd(int closeFd){
        char fd[16] = {'\0'};
        int num = -1;
        if((num = read(closeFd, fd, sizeof(fd)+1)) == -1){
            std::cerr << "read colseFd error!" << std::endl;
            return;
        }else if(num == 0){
            std::cerr << "closeFd[1] has been closed !" << std::endl;
            exit(-1);
        }else{
            int revFd = atoi(fd);
            if(revFd > 2){
                delete (FtpConsole*)&mConnection.find(revFd)->second;
                //delete console;
                mConnection.erase(revFd);   //remove client socket from the mConnection
                close(revFd);   //close client socket
            }
        }
    }